

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLOptions.h
# Opt level: O0

bool __thiscall CLOptions::ParseCommandLine(CLOptions *this,int argc,char **argv)

{
  char *pcVar1;
  CLOptions *pCVar2;
  int iVar3;
  long lVar4;
  reference pvVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  mapped_type *pmVar6;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_RDX;
  undefined4 in_ESI;
  long in_RDI;
  string *in_stack_00000008;
  CLOptions *in_stack_00000010;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  values;
  string opt_val;
  char c_char;
  string opt_name;
  int option_index;
  int c_1;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  short_to_long_map;
  string short_opts;
  int options_index;
  int c;
  bool use_default_configfile;
  CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffcd8;
  CLOptions *this_00;
  string *s;
  undefined4 uVar7;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pmVar8;
  string *this_01;
  undefined7 in_stack_fffffffffffffd38;
  byte in_stack_fffffffffffffd3f;
  string *in_stack_fffffffffffffd40;
  undefined7 in_stack_fffffffffffffd48;
  byte in_stack_fffffffffffffd4f;
  string *in_stack_fffffffffffffd50;
  int left_padding;
  undefined6 in_stack_fffffffffffffd58;
  byte in_stack_fffffffffffffd5e;
  byte in_stack_fffffffffffffd5f;
  CLOptions *in_stack_fffffffffffffd60;
  allocator local_241;
  string local_240 [63];
  undefined1 local_201 [33];
  int local_1e0;
  char local_1d9;
  string local_1d8 [32];
  string local_1b8 [32];
  undefined4 local_198;
  allocator local_191;
  string local_190 [32];
  int local_170;
  int local_16c;
  string local_138 [32];
  string local_118;
  string local_f8 [8];
  CLOptions *in_stack_ffffffffffffff10;
  string *in_stack_ffffffffffffff30;
  CLOptions *in_stack_ffffffffffffff38;
  string local_b0 [39];
  allocator local_89;
  string local_88 [55];
  allocator local_51;
  string *in_stack_ffffffffffffffb0;
  CLOptions *in_stack_ffffffffffffffb8;
  int local_2c;
  int local_28;
  byte local_21;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_20;
  undefined4 local_14;
  byte local_1;
  
  local_20 = in_RDX;
  local_14 = in_ESI;
  DefineParams(in_stack_ffffffffffffff10);
  lVar4 = std::__cxx11::string::size();
  if (lVar4 != 0) {
    local_21 = 1;
    do {
      do {
        uVar7 = local_14;
        pmVar8 = local_20;
        local_28 = 0;
        local_2c = -1;
        pvVar5 = std::vector<option,_std::allocator<option>_>::operator[]
                           ((vector<option,_std::allocator<option>_> *)(in_RDI + 8),0);
        local_28 = getopt_long_only(uVar7,pmVar8,"",pvVar5,&local_2c);
        if (local_28 == -1) goto LAB_00133290;
      } while (local_28 == 0);
      pvVar5 = std::vector<option,_std::allocator<option>_>::operator[]
                         ((vector<option,_std::allocator<option>_> *)(in_RDI + 8),(long)local_2c);
      pcVar1 = pvVar5->name;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&stack0xffffffffffffffb0,pcVar1,&local_51);
      iVar3 = std::__cxx11::string::compare((string *)&stack0xffffffffffffffb0);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
      std::allocator<char>::~allocator((allocator<char> *)&local_51);
    } while (iVar3 != 0);
    in_stack_fffffffffffffd60 = _optarg;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_88,(char *)in_stack_fffffffffffffd60,&local_89);
    in_stack_fffffffffffffd5f = FillFromFile(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    std::__cxx11::string::~string(local_88);
    std::allocator<char>::~allocator((allocator<char> *)&local_89);
    if ((in_stack_fffffffffffffd5f & 1) != 0) {
      local_1 = 1;
      goto LAB_00133a09;
    }
    local_21 = 0;
LAB_00133290:
    in_stack_fffffffffffffd4f = 0;
    in_stack_fffffffffffffd5e = in_stack_fffffffffffffd4f;
    if ((local_21 & 1) != 0) {
      in_stack_fffffffffffffd50 = (string *)&stack0xffffffffffffff30;
      std::__cxx11::string::string(in_stack_fffffffffffffd50,(string *)(in_RDI + 0x120));
      operator[](in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
      in_stack_fffffffffffffd4f = std::__cxx11::string::empty();
      in_stack_fffffffffffffd4f = in_stack_fffffffffffffd4f ^ 0xff;
      in_stack_fffffffffffffd5e = in_stack_fffffffffffffd4f;
      std::__cxx11::string::~string(local_b0);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff30);
    }
    if ((in_stack_fffffffffffffd4f & 1) != 0) {
      in_stack_fffffffffffffd40 = &local_118;
      std::__cxx11::string::string((string *)in_stack_fffffffffffffd40,(string *)(in_RDI + 0x120));
      operator[](in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
      in_stack_fffffffffffffd3f = FillFromFile(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
      std::__cxx11::string::~string(local_f8);
      std::__cxx11::string::~string((string *)&local_118);
      if ((in_stack_fffffffffffffd3f & 1) != 0) {
        local_1 = 1;
        goto LAB_00133a09;
      }
    }
  }
  _optind = 0;
  this_01 = local_138;
  std::__cxx11::string::string(this_01);
  GetShortOpts(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  while( true ) {
    local_16c = 0;
    local_170 = -1;
    uVar7 = local_14;
    pmVar8 = local_20;
    __x = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)std::__cxx11::string::c_str();
    pvVar5 = std::vector<option,_std::allocator<option>_>::operator[]
                       ((vector<option,_std::allocator<option>_> *)(in_RDI + 8),0);
    iVar3 = getopt_long(uVar7,pmVar8,__x,pvVar5,&local_170);
    left_padding = (int)((ulong)in_stack_fffffffffffffd50 >> 0x20);
    local_16c = iVar3;
    if (iVar3 == -1) break;
    if (iVar3 != 0) {
      if (iVar3 == 0x3f) {
        local_1 = 1;
        goto LAB_001339d1;
      }
      if (iVar3 == 0x68) {
        pcVar1 = *(char **)&(local_20->_M_t)._M_impl;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_190,pcVar1,&local_191);
        PrintHelp(in_stack_00000010,in_stack_00000008);
        std::__cxx11::string::~string(local_190);
        std::allocator<char>::~allocator((allocator<char> *)&local_191);
        local_1 = 1;
        goto LAB_001339d1;
      }
      if (iVar3 == 0x76) {
        CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        getValue(in_stack_fffffffffffffcd8);
        PrintDescription(in_stack_fffffffffffffd60,
                         (string *)
                         CONCAT17(in_stack_fffffffffffffd5f,
                                  CONCAT16(in_stack_fffffffffffffd5e,in_stack_fffffffffffffd58)),
                         left_padding);
        std::__cxx11::string::~string(local_1b8);
        local_1 = 1;
        goto LAB_001339d1;
      }
      std::__cxx11::string::string(local_1d8);
      if (local_170 < 0) {
        local_1d9 = (char)local_16c;
        local_1e0 = (int)(char)local_16c;
        pmVar6 = std::
                 map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](pmVar8,(key_type *)CONCAT44(uVar7,iVar3));
        std::__cxx11::string::operator=(local_1d8,(string *)pmVar6);
      }
      else {
        pvVar5 = std::vector<option,_std::allocator<option>_>::operator[]
                           ((vector<option,_std::allocator<option>_> *)(in_RDI + 8),(long)local_170)
        ;
        std::__cxx11::string::operator=(local_1d8,pvVar5->name);
      }
      s = (string *)local_201;
      this_00 = _optarg;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)(local_201 + 1),(char *)this_00,(allocator *)s);
      std::allocator<char>::~allocator((allocator<char> *)local_201);
      pCVar2 = _optarg;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_240,(char *)pCVar2,&local_241);
      CLOptionsHelper::split(s,(char)((ulong)this_00 >> 0x38));
      std::__cxx11::string::~string(local_240);
      std::allocator<char>::~allocator((allocator<char> *)&local_241);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this_01,__x);
      SetParam((CLOptions *)CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48),
               in_stack_fffffffffffffd40,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this_00);
      local_198 = 6;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this_00);
      std::__cxx11::string::~string((string *)(local_201 + 1));
      std::__cxx11::string::~string(local_1d8);
    }
  }
  local_1 = 0;
LAB_001339d1:
  local_198 = 1;
  std::
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)0x1339de);
  std::__cxx11::string::~string(local_138);
LAB_00133a09:
  return (bool)(local_1 & 1);
}

Assistant:

bool CLOptions::ParseCommandLine(int argc, char** argv)
{
    // Establish the actual parameters
    DefineParams() ;

    // If we've defined a configuration file parameter, do a pre-loop to see if
    // the user has passed that parameter
    if (configfile_opt_name.size() > 0) {
        // Loop until we find the config file name
        bool use_default_configfile(true) ;
        while(1) {
            int c(0), options_index(-1) ;
            
            c = getopt_long_only(argc, argv, "",
                                 &longopts[0], &options_index) ;
            if (c==-1) break;
            if (c==0) continue ;
            if (std::string(longopts[options_index].name).compare(configfile_opt_name)==0) {
                if (FillFromFile(optarg)) return true ;
                use_default_configfile = false ;
                break ;
            }
        }
        // If the config file info wasnt filled AND if the default filename isnt empty
        // fill the config options from the default file
        if ((use_default_configfile)&&(!(*this)[configfile_opt_name].empty())) {
            if (FillFromFile((*this)[configfile_opt_name])) return true ;
        }
    }
    
    // Reset the option index so that we can start over filling the options
    // that were passed on the command line
    optind = 0 ;
    
    std::string short_opts ;
    std::map<int, std::string> short_to_long_map = GetShortOpts(short_opts) ;

    // Loop through all the passed options
    while (1)
    {
        int c(0) ;

        /* getopt_long stores the option index here. */
        int option_index = -1;
                
        // If short form options were given, then enforce the "double-dash" policy
        // for long options
        c = getopt_long (argc, argv, short_opts.c_str(),
                         &longopts[0], &option_index);
        
        /* Detect the end of the options. */
        if (c == -1) break;
        
        // Now loop through all of the options to fill them based on their values
        switch (c)
        {
            case 0:
                /* If this option set a flag, do nothing else now. */
                break;
            case 'h':
                // Print the help message and quit
                PrintHelp(argv[0]) ;
                return true ;
            case 'v':
                // Print the version information
                PrintDescription(version_opt.getValue(), 0) ;
                return true ;
            case '?':
                // getopt_long already printed an error message. This will
                // most typically happen when an unrecognized option has 
                // been passed, or when an option expecting an argument 
                // was not given one on the commandline.
                return true ;
            default:
                // We have found an option, so get the option name
                std::string opt_name ;
                if (option_index >= 0) {
                    // The long form of the name was supplied
                    opt_name = longopts[option_index].name ;
                } else {
                    // The short form of the name was supplied
                    char c_char(c) ;
                    opt_name = short_to_long_map[c_char] ;
                }
                std::string opt_val ( optarg ) ;
                std::vector<std::string> values = CLOptionsHelper::split( optarg, ' ') ;
                SetParam(opt_name, values) ;
                
                break ;
        }
    }
    // Note that it is up to the user to handle conflicts between parameters
    return false ;
}